

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::TruncateLogFile(char *path,int64 limit,int64 keep)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  size_t __n;
  size_t sVar4;
  int *piVar5;
  SendMethod in_R9;
  long __offset;
  char *pcVar6;
  undefined1 local_20f8 [8];
  char copybuf [8192];
  undefined1 local_f0 [8];
  stat statbuf;
  __off_t local_58;
  LogMessage local_40;
  
  iVar1 = strncmp("/proc/self/fd/",path,0xe);
  iVar1 = open(path,(uint)(iVar1 != 0) << 0x11 | 2);
  if (iVar1 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 == 0x1b) {
      iVar1 = truncate(path,0);
      if (iVar1 != -1) {
        LogMessage::LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x911,2);
        poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Truncated ");
        poVar3 = std::operator<<(poVar3,path);
        std::operator<<(poVar3," due to EFBIG error");
        LogMessage::~LogMessage(&local_40);
        return;
      }
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x90f,2,0,in_R9);
      poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Unable to truncate ");
      std::operator<<(poVar3,path);
    }
    else {
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x914,2,0,in_R9);
      poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Unable to open ");
      std::operator<<(poVar3,path);
    }
    ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
    return;
  }
  iVar2 = fstat(iVar1,(stat *)local_f0);
  if (iVar2 == -1) {
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
               ,0x91a,2,0,in_R9);
    std::operator<<(&((local_40.data_)->stream_).super_ostream,"Unable to fstat()");
  }
  else {
    if ((((uint)statbuf.st_nlink & 0xf000) != 0x8000) ||
       (__offset = statbuf.st_rdev - keep,
       (__offset == 0 || (long)statbuf.st_rdev < keep) || (long)statbuf.st_rdev <= limit))
    goto LAB_001191b6;
    LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
               ,0x925);
    poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Truncating ");
    poVar3 = std::operator<<(poVar3,path);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3," bytes");
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)path;
    LogMessage::~LogMessage(&local_40);
    local_58 = 0;
    while (__n = pread(iVar1,local_20f8,0x2000,__offset),
          pcVar6 = (char *)statbuf.__glibc_reserved[2], 0 < (long)__n) {
      sVar4 = pwrite(iVar1,local_20f8,__n,local_58);
      if (sVar4 == 0xffffffffffffffff) {
        ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x92e,2,0,in_R9);
        poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Unable to write to ");
        pcVar6 = (char *)statbuf.__glibc_reserved[2];
        std::operator<<(poVar3,(char *)statbuf.__glibc_reserved[2]);
        ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
        goto LAB_00119369;
      }
      if (sVar4 != __n) {
        LogMessage::LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x931,2);
        poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Expected to write ");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3,", wrote ");
        std::ostream::_M_insert<long>((long)poVar3);
        LogMessage::~LogMessage(&local_40);
      }
      local_58 = local_58 + sVar4;
      __offset = __offset + __n;
    }
    if (__n == 0xffffffffffffffff) {
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x936,2,0,in_R9);
      poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Unable to read from ");
      std::operator<<(poVar3,pcVar6);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
    }
LAB_00119369:
    iVar2 = ftruncate(iVar1,local_58);
    if (iVar2 != -1) goto LAB_001191b6;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
               ,0x93c,2,0,in_R9);
    poVar3 = std::operator<<(&((local_40.data_)->stream_).super_ostream,"Unable to truncate ");
    std::operator<<(poVar3,pcVar6);
  }
  ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_40);
LAB_001191b6:
  close(iVar1);
  return;
}

Assistant:

void TruncateLogFile(const char *path, int64 limit, int64 keep) {
#ifdef HAVE_UNISTD_H
  struct stat statbuf;
  const int kCopyBlockSize = 8 << 10;
  char copybuf[kCopyBlockSize];
  off_t read_offset, write_offset;
  // Don't follow symlinks unless they're our own fd symlinks in /proc
  int flags = O_RDWR;
  // TODO(hamaji): Support other environments.
#ifdef GLOG_OS_LINUX
  const char *procfd_prefix = "/proc/self/fd/";
  if (strncmp(procfd_prefix, path, strlen(procfd_prefix))) flags |= O_NOFOLLOW;
#endif

  int fd = open(path, flags);
  if (fd == -1) {
    if (errno == EFBIG) {
      // The log file in question has got too big for us to open. The
      // real fix for this would be to compile logging.cc (or probably
      // all of base/...) with -D_FILE_OFFSET_BITS=64 but that's
      // rather scary.
      // Instead just truncate the file to something we can manage
      if (truncate(path, 0) == -1) {
        PLOG(ERROR) << "Unable to truncate " << path;
      } else {
        LOG(ERROR) << "Truncated " << path << " due to EFBIG error";
      }
    } else {
      PLOG(ERROR) << "Unable to open " << path;
    }
    return;
  }

  if (fstat(fd, &statbuf) == -1) {
    PLOG(ERROR) << "Unable to fstat()";
    goto out_close_fd;
  }

  // See if the path refers to a regular file bigger than the
  // specified limit
  if (!S_ISREG(statbuf.st_mode)) goto out_close_fd;
  if (statbuf.st_size <= limit)  goto out_close_fd;
  if (statbuf.st_size <= keep) goto out_close_fd;

  // This log file is too large - we need to truncate it
  LOG(INFO) << "Truncating " << path << " to " << keep << " bytes";

  // Copy the last "keep" bytes of the file to the beginning of the file
  read_offset = statbuf.st_size - keep;
  write_offset = 0;
  ssize_t bytesin, bytesout;
  while ((bytesin = pread(fd, copybuf, sizeof(copybuf), read_offset)) > 0) {
    bytesout = pwrite(fd, copybuf, static_cast<size_t>(bytesin), write_offset);
    if (bytesout == -1) {
      PLOG(ERROR) << "Unable to write to " << path;
      break;
    } else if (bytesout != bytesin) {
      LOG(ERROR) << "Expected to write " << bytesin << ", wrote " << bytesout;
    }
    read_offset += bytesin;
    write_offset += bytesout;
  }
  if (bytesin == -1) PLOG(ERROR) << "Unable to read from " << path;

  // Truncate the remainder of the file. If someone else writes to the
  // end of the file after our last read() above, we lose their latest
  // data. Too bad ...
  if (ftruncate(fd, write_offset) == -1) {
    PLOG(ERROR) << "Unable to truncate " << path;
  }

 out_close_fd:
  close(fd);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}